

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int moveToLeftmost(BtCursor *pCur)

{
  u32 newPgno;
  bool bVar1;
  MemPage *local_20;
  MemPage *pPage;
  int rc;
  Pgno pgno;
  BtCursor *pCur_local;
  
  pPage._0_4_ = 0;
  while( true ) {
    bVar1 = false;
    if ((int)pPage == 0) {
      local_20 = pCur->apPage[pCur->iPage];
      bVar1 = local_20->leaf == '\0';
    }
    if (!bVar1) break;
    newPgno = sqlite3Get4byte(local_20->aData +
                              (int)(uint)(local_20->maskPage &
                                         CONCAT11(local_20->aCellIdx[(int)((uint)pCur->ix << 1)],
                                                  local_20->aCellIdx
                                                  [(long)(int)((uint)pCur->ix << 1) + 1])));
    pPage._0_4_ = moveToChild(pCur,newPgno);
  }
  return (int)pPage;
}

Assistant:

static int moveToLeftmost(BtCursor *pCur){
  Pgno pgno;
  int rc = SQLITE_OK;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  while( rc==SQLITE_OK && !(pPage = pCur->apPage[pCur->iPage])->leaf ){
    assert( pCur->ix<pPage->nCell );
    pgno = get4byte(findCell(pPage, pCur->ix));
    rc = moveToChild(pCur, pgno);
  }
  return rc;
}